

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape.cpp
# Opt level: O2

int __thiscall ncnn::Reshape::forward(Reshape *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  size_t _elemsize;
  uint uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  void *pvVar5;
  int i_3;
  undefined4 *puVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int i_1;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined4 *puVar14;
  ulong uVar15;
  undefined4 *puVar16;
  int i;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  int k;
  int iVar20;
  bool bVar21;
  uint local_16c;
  uint local_168;
  uint local_164;
  long local_160;
  int local_14c;
  Mat bottom_blob_permuted;
  Mat top_blob_permuted;
  Mat local_80;
  ulong local_38;
  
  _elemsize = bottom_blob->elemsize;
  uVar10 = bottom_blob->w;
  uVar11 = bottom_blob->h;
  uVar8 = bottom_blob->c;
  uVar7 = bottom_blob->d * uVar8 * uVar11 * uVar10;
  iVar20 = bottom_blob->dims;
  local_16c = this->w;
  local_168 = this->h;
  local_14c = this->d;
  local_164 = this->c;
  iVar9 = this->ndim;
  if (iVar9 == 1) {
    if (local_16c == 0) {
      local_16c = uVar10;
    }
    if (local_16c == 0xffffffff) {
      local_16c = uVar7;
    }
    bVar4 = 0;
    if (iVar20 == 1) {
      bVar2 = 0;
      bVar3 = 0;
      if (uVar10 == local_16c) {
LAB_001e9584:
        Mat::operator=(top_blob,bottom_blob);
        return 0;
      }
    }
    else {
LAB_001e97a1:
      bVar2 = 0;
LAB_001e97a3:
      bVar4 = 0;
      bVar3 = 0;
    }
  }
  else if (iVar9 == 4) {
    if (local_16c == 0) {
      local_16c = uVar10;
    }
    if (local_168 == 0) {
      local_168 = uVar11;
    }
    if (local_164 == 0) {
      local_164 = uVar8;
    }
    iVar17 = bottom_blob->d;
    if (local_14c != 0) {
      iVar17 = local_14c;
    }
    if (local_16c == 0xffffffff) {
      uVar19 = (long)((ulong)(uint)((int)((long)(int)uVar7 / (long)(int)local_164) >> 0x1f) << 0x20
                     | (long)(int)uVar7 / (long)(int)local_164 & 0xffffffffU) / (long)iVar17;
      local_16c = (uint)((long)((ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff) /
                        (long)(int)local_168);
    }
    if (local_168 == 0xffffffff) {
      uVar19 = (long)((ulong)(uint)((int)((long)(int)uVar7 / (long)(int)local_164) >> 0x1f) << 0x20
                     | (long)(int)uVar7 / (long)(int)local_164 & 0xffffffffU) / (long)iVar17;
      local_168 = (uint)((long)((ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff) /
                        (long)(int)local_16c);
    }
    if (iVar17 == -1) {
      uVar19 = (long)((ulong)(uint)((int)((long)(int)uVar7 / (long)(int)local_164) >> 0x1f) << 0x20
                     | (long)(int)uVar7 / (long)(int)local_164 & 0xffffffffU) / (long)(int)local_168
      ;
      iVar17 = (int)((long)((ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff) /
                    (long)(int)local_16c);
    }
    if (local_164 == 0xffffffff) {
      uVar19 = (long)((ulong)(uint)((int)((long)(int)uVar7 / (long)iVar17) >> 0x1f) << 0x20 |
                     (long)(int)uVar7 / (long)iVar17 & 0xffffffffU) / (long)(int)local_168;
      local_164 = (uint)((long)((ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff) /
                        (long)(int)local_16c);
    }
    bVar2 = 0;
    bVar4 = 1;
    if ((iVar20 == 4) && (uVar8 == local_164)) {
      Mat::operator=(top_blob,bottom_blob);
      top_blob->w = local_16c;
      top_blob->h = local_168;
      top_blob->d = iVar17;
      return 0;
    }
    bVar3 = 0;
    local_14c = iVar17;
  }
  else if (iVar9 == 3) {
    if (local_16c == 0) {
      local_16c = uVar10;
    }
    if (local_168 == 0) {
      local_168 = uVar11;
    }
    if (local_164 == 0) {
      local_164 = uVar8;
    }
    if (local_16c == 0xffffffff) {
      local_16c = (uint)((long)((ulong)(uint)((int)((long)(int)uVar7 / (long)(int)local_164) >> 0x1f
                                             ) << 0x20 |
                               (long)(int)uVar7 / (long)(int)local_164 & 0xffffffffU) /
                        (long)(int)local_168);
    }
    if (local_168 == 0xffffffff) {
      local_168 = (uint)((long)((ulong)(uint)((int)((long)(int)uVar7 / (long)(int)local_164) >> 0x1f
                                             ) << 0x20 |
                               (long)(int)uVar7 / (long)(int)local_164 & 0xffffffffU) /
                        (long)(int)local_16c);
    }
    if (local_164 == 0xffffffff) {
      local_164 = (uint)((long)((ulong)(uint)((int)((long)(int)uVar7 / (long)(int)local_168) >> 0x1f
                                             ) << 0x20 |
                               (long)(int)uVar7 / (long)(int)local_168 & 0xffffffffU) /
                        (long)(int)local_16c);
    }
    bVar4 = 0;
    bVar3 = 1;
    if ((iVar20 == 3) && (uVar8 == local_164)) {
      Mat::operator=(top_blob,bottom_blob);
      top_blob->w = local_16c;
      top_blob->h = local_168;
      return 0;
    }
    bVar2 = 0;
  }
  else {
    if (iVar9 != 2) goto LAB_001e97a1;
    if (local_16c == 0) {
      local_16c = uVar10;
    }
    if (local_168 == 0) {
      local_168 = uVar11;
    }
    if (local_16c == 0xffffffff) {
      local_16c = (int)uVar7 / (int)local_168;
    }
    if (local_168 == 0xffffffff) {
      local_168 = (int)uVar7 / (int)local_16c;
    }
    bVar4 = 0;
    bVar2 = 1;
    if (iVar20 != 2) goto LAB_001e97a3;
    bVar3 = 0;
    if (uVar11 == local_168) goto LAB_001e9584;
  }
  if ((((bool)((iVar20 == 4 & bVar4 | iVar20 == 3 & bVar3) & uVar8 == local_164)) ||
      ((bool)(iVar20 == 2 & bVar2 & uVar11 == local_168))) || (this->permute != 1)) {
    if (iVar9 == 1) {
      Mat::reshape(&bottom_blob_permuted,bottom_blob,local_16c,opt->blob_allocator);
      Mat::operator=(top_blob,&bottom_blob_permuted);
      Mat::~Mat(&bottom_blob_permuted);
      iVar9 = this->ndim;
    }
    if (iVar9 == 2) {
      Mat::reshape(&bottom_blob_permuted,bottom_blob,local_16c,local_168,opt->blob_allocator);
      Mat::operator=(top_blob,&bottom_blob_permuted);
      Mat::~Mat(&bottom_blob_permuted);
      iVar9 = this->ndim;
    }
    if (iVar9 == 3) {
      Mat::reshape(&bottom_blob_permuted,bottom_blob,local_16c,local_168,local_164,
                   opt->blob_allocator);
      Mat::operator=(top_blob,&bottom_blob_permuted);
      Mat::~Mat(&bottom_blob_permuted);
      iVar9 = this->ndim;
    }
    if (iVar9 == 4) {
      Mat::reshape(&bottom_blob_permuted,bottom_blob,local_16c,local_168,local_14c,local_164,
                   opt->blob_allocator);
      Mat::operator=(top_blob,&bottom_blob_permuted);
      Mat::~Mat(&bottom_blob_permuted);
    }
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      return 0;
    }
    return -100;
  }
  Mat::Mat(&bottom_blob_permuted,bottom_blob);
  if (iVar20 == 2) {
    uVar10 = bottom_blob->w;
    uVar11 = bottom_blob->h;
    Mat::create(&bottom_blob_permuted,uVar11,uVar10,_elemsize,opt->workspace_allocator);
    local_160._0_4_ = -100;
    if ((bottom_blob_permuted.data == (void *)0x0) ||
       ((long)bottom_blob_permuted.c * bottom_blob_permuted.cstep == 0)) goto LAB_001ea20a;
    puVar6 = (undefined4 *)bottom_blob->data;
    uVar13 = 0;
    uVar19 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar19 = uVar13;
    }
    puVar16 = (undefined4 *)bottom_blob_permuted.data;
    uVar15 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar15 = uVar13;
    }
    for (; puVar14 = puVar6, uVar12 = uVar19, uVar13 != uVar15; uVar13 = uVar13 + 1) {
      while (uVar12 != 0) {
        *puVar16 = *puVar14;
        puVar16 = puVar16 + 1;
        puVar14 = puVar14 + (int)uVar10;
        uVar12 = uVar12 - 1;
      }
      puVar6 = puVar6 + 1;
    }
  }
  if (iVar20 == 3) {
    uVar10 = bottom_blob->w;
    uVar11 = bottom_blob->h;
    uVar8 = bottom_blob->c;
    Mat::create(&bottom_blob_permuted,uVar8,uVar10,uVar11,_elemsize,opt->workspace_allocator);
    local_160._0_4_ = -100;
    if ((bottom_blob_permuted.data == (void *)0x0) ||
       ((long)bottom_blob_permuted.c * bottom_blob_permuted.cstep == 0)) goto LAB_001ea20a;
    uVar13 = 0;
    uVar19 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar19 = uVar13;
    }
    uVar15 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar15 = uVar13;
    }
    uVar12 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar12 = uVar13;
    }
    for (; uVar13 != uVar12; uVar13 = uVar13 + 1) {
      Mat::channel(&top_blob_permuted,&bottom_blob_permuted,(int)uVar13);
      puVar6 = (undefined4 *)top_blob_permuted.data;
      Mat::~Mat(&top_blob_permuted);
      for (uVar18 = 0; uVar18 != uVar15; uVar18 = uVar18 + 1) {
        for (iVar9 = 0; (int)uVar19 != iVar9; iVar9 = iVar9 + 1) {
          Mat::channel(&top_blob_permuted,bottom_blob,iVar9);
          *puVar6 = *(undefined4 *)
                     ((long)top_blob_permuted.data +
                     uVar18 * 4 +
                     (long)top_blob_permuted.w * uVar13 *
                     CONCAT44(top_blob_permuted.elemsize._4_4_,
                              (undefined4)top_blob_permuted.elemsize));
          puVar6 = puVar6 + 1;
          Mat::~Mat(&top_blob_permuted);
        }
      }
    }
  }
  if (iVar20 == 4) {
    uVar10 = bottom_blob->w;
    uVar11 = bottom_blob->h;
    uVar8 = bottom_blob->d;
    iVar20 = bottom_blob->c;
    Mat::create(&bottom_blob_permuted,iVar20,uVar10,uVar11,uVar8,_elemsize,opt->workspace_allocator)
    ;
    local_160._0_4_ = -100;
    if ((bottom_blob_permuted.data == (void *)0x0) ||
       ((long)bottom_blob_permuted.c * bottom_blob_permuted.cstep == 0)) goto LAB_001ea20a;
    if (iVar20 < 1) {
      iVar20 = 0;
    }
    uVar19 = (ulong)uVar10;
    if ((int)uVar10 < 1) {
      uVar19 = 0;
    }
    uVar13 = 0;
    local_38 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      local_38 = uVar13;
    }
    uVar15 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar15 = uVar13;
    }
    while( true ) {
      iVar9 = (int)uVar13;
      if (iVar9 == (int)uVar15) break;
      Mat::channel(&top_blob_permuted,&bottom_blob_permuted,iVar9);
      puVar6 = (undefined4 *)top_blob_permuted.data;
      Mat::~Mat(&top_blob_permuted);
      for (uVar13 = 0; uVar13 != local_38; uVar13 = uVar13 + 1) {
        for (uVar12 = 0; uVar12 != uVar19; uVar12 = uVar12 + 1) {
          for (iVar17 = 0; iVar20 != iVar17; iVar17 = iVar17 + 1) {
            Mat::channel(&local_80,bottom_blob,iVar17);
            Mat::depth(&top_blob_permuted,&local_80,iVar9);
            *puVar6 = *(undefined4 *)
                       ((long)top_blob_permuted.data +
                       uVar12 * 4 +
                       (long)top_blob_permuted.w * uVar13 *
                       CONCAT44(top_blob_permuted.elemsize._4_4_,
                                (undefined4)top_blob_permuted.elemsize));
            puVar6 = puVar6 + 1;
            Mat::~Mat(&top_blob_permuted);
            Mat::~Mat(&local_80);
          }
        }
      }
      uVar13 = (ulong)(iVar9 + 1);
    }
  }
  iVar20 = this->ndim;
  if (iVar20 == 1) {
    Mat::reshape(&top_blob_permuted,&bottom_blob_permuted,local_16c,opt->blob_allocator);
    Mat::operator=(top_blob,&top_blob_permuted);
    Mat::~Mat(&top_blob_permuted);
    if ((top_blob->data == (void *)0x0) ||
       (local_160._0_4_ = 0, (long)top_blob->c * top_blob->cstep == 0)) {
      local_160._0_4_ = -100;
    }
    goto LAB_001ea20a;
  }
  top_blob_permuted.cstep = 0;
  top_blob_permuted.data = (void *)0x0;
  top_blob_permuted.refcount._0_4_ = 0;
  top_blob_permuted.refcount._4_4_ = 0;
  top_blob_permuted.elemsize._0_4_ = 0;
  top_blob_permuted.elemsize._4_4_ = 0;
  top_blob_permuted.elempack = 0;
  top_blob_permuted.allocator = (Allocator *)0x0;
  top_blob_permuted.dims = 0;
  top_blob_permuted.w = 0;
  top_blob_permuted.h = 0;
  top_blob_permuted.d = 0;
  top_blob_permuted.c = 0;
  if (iVar20 == 2) {
    Mat::reshape(&local_80,&bottom_blob_permuted,local_168,local_16c,opt->workspace_allocator);
    Mat::operator=(&top_blob_permuted,&local_80);
    Mat::~Mat(&local_80);
    iVar20 = this->ndim;
  }
  if (iVar20 == 3) {
    Mat::reshape(&local_80,&bottom_blob_permuted,local_164,local_16c,local_168,
                 opt->workspace_allocator);
    Mat::operator=(&top_blob_permuted,&local_80);
    Mat::~Mat(&local_80);
    iVar20 = this->ndim;
  }
  if (iVar20 == 4) {
    Mat::reshape(&local_80,&bottom_blob_permuted,local_164,local_16c,local_168,local_14c,
                 opt->workspace_allocator);
    Mat::operator=(&top_blob_permuted,&local_80);
    Mat::~Mat(&local_80);
  }
  if ((top_blob_permuted.data == (void *)0x0) ||
     ((long)top_blob_permuted.c * top_blob_permuted.cstep == 0)) {
LAB_001ea1f9:
    local_160._0_4_ = -100;
  }
  else {
    iVar20 = this->ndim;
    if (iVar20 == 2) {
      Mat::create(top_blob,local_16c,local_168,_elemsize,opt->blob_allocator);
      puVar6 = (undefined4 *)top_blob->data;
      if ((puVar6 == (undefined4 *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
      goto LAB_001ea1f9;
      uVar19 = 0;
      uVar13 = 0;
      if (0 < (int)local_16c) {
        uVar13 = (ulong)local_16c;
      }
      uVar15 = 0;
      puVar16 = (undefined4 *)top_blob_permuted.data;
      if (0 < (int)local_168) {
        uVar15 = (ulong)local_168;
      }
      for (; puVar14 = puVar16, uVar12 = uVar13, uVar19 != uVar15; uVar19 = uVar19 + 1) {
        while (uVar12 != 0) {
          *puVar6 = *puVar14;
          puVar6 = puVar6 + 1;
          puVar14 = puVar14 + (int)local_168;
          uVar12 = uVar12 - 1;
        }
        puVar16 = puVar16 + 1;
      }
      iVar20 = this->ndim;
    }
    if (iVar20 == 3) {
      Mat::create(top_blob,local_16c,local_168,local_164,_elemsize,opt->blob_allocator);
      if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
      goto LAB_001ea1f9;
      local_160 = 0;
      uVar19 = 0;
      if (0 < (int)local_16c) {
        uVar19 = (ulong)local_16c;
      }
      uVar10 = 0;
      if (0 < (int)local_168) {
        uVar10 = local_168;
      }
      uVar13 = 0;
      if (0 < (int)local_164) {
        uVar13 = (ulong)local_164;
      }
      for (uVar15 = 0; uVar15 != uVar13; uVar15 = uVar15 + 1) {
        Mat::channel(&local_80,top_blob,(int)uVar15);
        puVar6 = (undefined4 *)local_80.data;
        Mat::~Mat(&local_80);
        for (uVar11 = 0; uVar11 != uVar10; uVar11 = uVar11 + 1) {
          Mat::channel(&local_80,&top_blob_permuted,uVar11);
          puVar16 = (undefined4 *)((long)local_80.data + local_160);
          Mat::~Mat(&local_80);
          uVar12 = uVar19;
          while (bVar21 = uVar12 != 0, uVar12 = uVar12 - 1, bVar21) {
            *puVar6 = *puVar16;
            puVar6 = puVar6 + 1;
            puVar16 = puVar16 + (int)local_164;
          }
        }
        local_160 = local_160 + 4;
      }
      iVar20 = this->ndim;
    }
    local_160._0_4_ = 0;
    if (iVar20 == 4) {
      Mat::create(top_blob,local_16c,local_168,local_14c,local_164,_elemsize,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) goto LAB_001ea1f9;
      local_160._0_4_ = -100;
      if ((long)top_blob->c * top_blob->cstep != 0) {
        uVar19 = 0;
        if (0 < (int)local_16c) {
          uVar19 = (ulong)local_16c;
        }
        if ((int)local_168 < 1) {
          local_168 = 0;
        }
        local_160._0_4_ = 0;
        if (local_14c < 1) {
          local_14c = 0;
        }
        uVar10 = 0;
        if (0 < (int)local_164) {
          uVar10 = local_164;
        }
        for (uVar11 = 0; uVar11 != uVar10; uVar11 = uVar11 + 1) {
          Mat::channel(&local_80,top_blob,uVar11);
          puVar6 = (undefined4 *)local_80.data;
          Mat::~Mat(&local_80);
          for (iVar20 = 0; iVar20 != local_14c; iVar20 = iVar20 + 1) {
            Mat::channel(&local_80,&top_blob_permuted,iVar20);
            pvVar5 = local_80.data;
            Mat::~Mat(&local_80);
            uVar8 = uVar11;
            for (uVar7 = 0; uVar13 = uVar19, uVar1 = uVar8, uVar7 != local_168; uVar7 = uVar7 + 1) {
              while (uVar13 != 0) {
                *puVar6 = *(undefined4 *)((long)pvVar5 + (long)(int)uVar1 * 4);
                puVar6 = puVar6 + 1;
                uVar13 = uVar13 - 1;
                uVar1 = uVar1 + local_164;
              }
              uVar8 = uVar8 + local_16c * local_164;
            }
          }
        }
      }
    }
  }
  Mat::~Mat(&top_blob_permuted);
LAB_001ea20a:
  Mat::~Mat(&bottom_blob_permuted);
  return (int)local_160;
}

Assistant:

int Reshape::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    size_t elemsize = bottom_blob.elemsize;
    int total = bottom_blob.w * bottom_blob.h * bottom_blob.d * bottom_blob.c;

    int dims = bottom_blob.dims;

    // resolve out shape

    int outw = w;
    int outh = h;
    int outd = d;
    int outc = c;

    if (ndim == 1)
    {
        if (outw == 0)
            outw = bottom_blob.w;

        if (outw == -1)
            outw = total;

        if (dims == 1 && bottom_blob.w == outw)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }
    if (ndim == 2)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;

        if (outw == -1)
            outw = total / outh;
        if (outh == -1)
            outh = total / outw;

        if (dims == 2 && bottom_blob.h == outh)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }
    if (ndim == 3)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;
        if (outc == 0)
            outc = bottom_blob.c;

        if (outw == -1)
            outw = total / outc / outh;
        if (outh == -1)
            outh = total / outc / outw;
        if (outc == -1)
            outc = total / outh / outw;

        if (dims == 3 && bottom_blob.c == outc)
        {
            top_blob = bottom_blob;
            top_blob.w = outw;
            top_blob.h = outh;
            return 0;
        }
    }
    if (ndim == 4)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;
        if (outc == 0)
            outc = bottom_blob.c;
        if (outd == 0)
            outd = bottom_blob.d;

        if (outw == -1)
            outw = total / outc / outd / outh;
        if (outh == -1)
            outh = total / outc / outd / outw;
        if (outd == -1)
            outd = total / outc / outh / outw;
        if (outc == -1)
            outc = total / outd / outh / outw;

        if (dims == 4 && bottom_blob.c == outc)
        {
            top_blob = bottom_blob;
            top_blob.w = outw;
            top_blob.h = outh;
            top_blob.d = outd;
            return 0;
        }
    }

    bool need_permute = permute == 1;
    if (dims == 2 && ndim == 2 && bottom_blob.h == outh)
        need_permute = false;
    if (dims == 3 && ndim == 3 && bottom_blob.c == outc)
        need_permute = false;
    if (dims == 4 && ndim == 4 && bottom_blob.c == outc)
        need_permute = false;

    if (need_permute)
    {
        Mat bottom_blob_permuted = bottom_blob;

        if (dims == 2)
        {
            // hw -> wh
            int _w = bottom_blob.w;
            int _h = bottom_blob.h;

            bottom_blob_permuted.create(_h, _w, elemsize, opt.workspace_allocator);
            if (bottom_blob_permuted.empty())
                return -100;

            const float* ptr = bottom_blob;
            float* outptr = bottom_blob_permuted;

            for (int i = 0; i < _w; i++)
            {
                for (int j = 0; j < _h; j++)
                {
                    *outptr++ = ptr[j * _w + i];
                }
            }
        }
        if (dims == 3)
        {
            // chw -> hwc
            int _w = bottom_blob.w;
            int _h = bottom_blob.h;
            int channels = bottom_blob.c;

            bottom_blob_permuted.create(channels, _w, _h, elemsize, opt.workspace_allocator);
            if (bottom_blob_permuted.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < _h; q++)
            {
                float* outptr = bottom_blob_permuted.channel(q);

                for (int i = 0; i < _w; i++)
                {
                    for (int j = 0; j < channels; j++)
                    {
                        *outptr++ = bottom_blob.channel(j).row(q)[i];
                    }
                }
            }
        }

        if (dims == 4)
        {
            // cdhw -> dhwc
            int _w = bottom_blob.w;
            int _h = bottom_blob.h;
            int _d = bottom_blob.d;
            int channels = bottom_blob.c;

            bottom_blob_permuted.create(channels, _w, _h, _d, elemsize, opt.workspace_allocator);
            if (bottom_blob_permuted.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int z = 0; z < _d; z++)
            {
                float* outptr = bottom_blob_permuted.channel(z);

                for (int q = 0; q < _h; q++)
                {
                    for (int i = 0; i < _w; i++)
                    {
                        for (int j = 0; j < channels; j++)
                        {
                            *outptr++ = bottom_blob.channel(j).depth(z).row(q)[i];
                        }
                    }
                }
            }
        }

        if (ndim == 1)
        {
            top_blob = bottom_blob_permuted.reshape(outw, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            return 0;
        }

        // permute on ndhwc/nhwc/nhc
        Mat top_blob_permuted;
        if (ndim == 2)
        {
            top_blob_permuted = bottom_blob_permuted.reshape(outh, outw, opt.workspace_allocator);
        }
        if (ndim == 3)
        {
            top_blob_permuted = bottom_blob_permuted.reshape(outc, outw, outh, opt.workspace_allocator);
        }
        if (ndim == 4)
        {
            top_blob_permuted = bottom_blob_permuted.reshape(outc, outw, outh, outd, opt.workspace_allocator);
        }
        if (top_blob_permuted.empty())
            return -100;

        if (ndim == 2)
        {
            // wh -> hw
            top_blob.create(outw, outh, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = top_blob_permuted;
            float* outptr = top_blob;

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    *outptr++ = ptr[j * outh + i];
                }
            }
        }
        if (ndim == 3)
        {
            // hwc -> chw
            top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    const float* ptr = top_blob_permuted.channel(i);

                    for (int j = 0; j < outw; j++)
                    {
                        *outptr++ = ptr[j * outc + q];
                    }
                }
            }
        }
        if (ndim == 4)
        {
            // dhwc -> cdhw
            top_blob.create(outw, outh, outd, outc, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int k = 0; k < outd; k++)
                {
                    const float* ptr = top_blob_permuted.channel(k);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            *outptr++ = ptr[i * outw * outc + j * outc + q];
                        }
                    }
                }
            }
        }

        return 0;
    }

    if (ndim == 1)
    {
        top_blob = bottom_blob.reshape(outw, opt.blob_allocator);
    }
    if (ndim == 2)
    {
        top_blob = bottom_blob.reshape(outw, outh, opt.blob_allocator);
    }
    if (ndim == 3)
    {
        top_blob = bottom_blob.reshape(outw, outh, outc, opt.blob_allocator);
    }
    if (ndim == 4)
    {
        top_blob = bottom_blob.reshape(outw, outh, outd, outc, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    return 0;
}